

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_bitmapblit_template<unsigned_int>
               (QRasterBuffer *rasterBuffer,int x,int y,uint color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uchar uVar6;
  uchar *puVar7;
  int x_1;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  puVar7 = rasterBuffer->m_buffer + (long)x * 4 + (long)y * rasterBuffer->bytes_per_line;
  iVar4 = (int)((ulong)rasterBuffer->bytes_per_line >> 2);
  if (mapWidth < 9) {
    if (0 < mapHeight) {
      do {
        uVar6 = *map;
        if (uVar6 == '\0') {
          lVar3 = 0;
          iVar5 = 0;
        }
        else {
          iVar5 = 0;
          iVar10 = 0;
          do {
            if ((char)uVar6 < '\0') {
              iVar5 = iVar5 + 1;
            }
            else {
              if (iVar5 != 0) {
                (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar10 * 4),color,(long)iVar5);
                iVar10 = iVar10 + iVar5;
              }
              iVar10 = iVar10 + 1;
              iVar5 = 0;
            }
            uVar6 = uVar6 * '\x02';
          } while (uVar6 != '\0');
          lVar3 = (long)iVar10;
        }
        if (iVar5 != 0) {
          (*qt_memfill32)((quint32 *)(puVar7 + lVar3 * 4),color,(long)iVar5);
        }
        puVar7 = puVar7 + (long)iVar4 * 4;
        map = map + mapStride;
        bVar1 = 1 < mapHeight;
        mapHeight = mapHeight + -1;
      } while (bVar1);
    }
  }
  else if (0 < mapHeight) {
    do {
      uVar8 = 0;
      iVar10 = 0;
      iVar5 = 0;
      do {
        uVar6 = map[uVar8 >> 3];
        iVar9 = -8;
        do {
          if ((char)uVar6 < '\0') {
            iVar10 = iVar10 + 1;
          }
          else {
            if (iVar10 == 0) {
              iVar2 = 1;
            }
            else {
              (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar5 * 4),color,(long)iVar10);
              iVar2 = iVar10 + 1;
            }
            if (uVar6 == '\0') {
              iVar5 = (iVar10 + iVar5) - iVar9;
              iVar10 = 0;
              break;
            }
            iVar5 = iVar5 + iVar2;
            iVar10 = 0;
          }
          uVar6 = uVar6 * '\x02';
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        uVar8 = uVar8 + 8;
      } while ((int)uVar8 < mapWidth);
      if (iVar10 != 0) {
        (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar5 * 4),color,(long)iVar10);
      }
      puVar7 = puVar7 + (long)iVar4 * 4;
      map = map + mapStride;
      bVar1 = 1 < mapHeight;
      mapHeight = mapHeight + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

static
inline void qt_bitmapblit_template(QRasterBuffer *rasterBuffer,
                                   int x, int y, DST color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    DST *dest = reinterpret_cast<DST *>(rasterBuffer->scanLine(y)) + x;
    const int destStride = rasterBuffer->stride<DST>();

    if (mapWidth > 8) {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (int x = 0; x < mapWidth; x += 8) {
                uchar s = map[x >> 3];
                for (int i = 0; i < 8; ++i) {
                    if (s & 0x80) {
                        ++n;
                    } else {
                        if (n) {
                            qt_memfill(dest + x0, color, n);
                            x0 += n + 1;
                            n = 0;
                        } else {
                            ++x0;
                        }
                        if (!s) {
                            x0 += 8 - 1 - i;
                            break;
                        }
                    }
                    s <<= 1;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    } else {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (uchar s = *map; s; s <<= 1) {
                if (s & 0x80) {
                    ++n;
                } else if (n) {
                    qt_memfill(dest + x0, color, n);
                    x0 += n + 1;
                    n = 0;
                } else {
                    ++x0;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    }
}